

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

DataType glu::getSampler3DType(TextureFormat format)

{
  TextureChannelClass TVar1;
  ChannelOrder local_14;
  ChannelType CStack_10;
  TextureFormat format_local;
  
  local_14 = format.order;
  if ((local_14 == D) || (local_14 == DS)) {
    format_local.order = 0x2c;
  }
  else if (local_14 == S) {
    format_local.order = 0x5e;
  }
  else {
    CStack_10 = format.type;
    TVar1 = tcu::getTextureChannelClass(CStack_10);
    switch(TVar1) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      format_local.order = 0x2c;
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      format_local.order = 0x39;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      format_local.order = 0x40;
      break;
    default:
      format_local.order = 0x5e;
    }
  }
  return format_local.order;
}

Assistant:

DataType getSampler3DType (tcu::TextureFormat format)
{
	using tcu::TextureFormat;

	if (format.order == TextureFormat::D || format.order == TextureFormat::DS)
		return TYPE_SAMPLER_3D;

	if (format.order == TextureFormat::S)
		return TYPE_LAST;

	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return glu::TYPE_SAMPLER_3D;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return glu::TYPE_INT_SAMPLER_3D;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return glu::TYPE_UINT_SAMPLER_3D;

		default:
			return glu::TYPE_LAST;
	}
}